

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O3

void __thiscall
PSVIWriterHandlers::processSimpleTypeDefinition
          (PSVIWriterHandlers *this,XSSimpleTypeDefinition *simpleType)

{
  char cVar1;
  XMLCh *pXVar2;
  XSTypeDefinition *pXVar3;
  
  sendIndentedElementWithID
            (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSimpleTypeDefinition,(XSObject *)simpleType);
  cVar1 = (**(code **)(*(long *)simpleType + 0x38))(simpleType);
  if (cVar1 == '\0') {
    pXVar2 = (XMLCh *)(**(code **)(*(long *)simpleType + 0x10))(simpleType);
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgName,pXVar2);
  }
  else {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgName);
  }
  pXVar2 = (XMLCh *)(**(code **)(*(long *)simpleType + 0x18))(simpleType);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTargetNamespace,pXVar2);
  pXVar3 = (XSTypeDefinition *)(**(code **)(*(long *)simpleType + 0x30))(simpleType);
  processTypeDefinitionOrRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgBaseTypeDefinition,pXVar3);
  if (*(int *)(simpleType + 0x40) == 1) {
    pXVar3 = *(XSTypeDefinition **)(simpleType + 0x68);
  }
  else {
    pXVar3 = (XSTypeDefinition *)0x0;
  }
  processTypeDefinitionOrRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrimitiveTypeDefinition,pXVar3);
  processFacets(this,*(XSFacetList **)(simpleType + 0x50),
                *(XSMultiValueFacetList **)(simpleType + 0x58));
  processFundamentalFacets(this,simpleType);
  pXVar2 = translateBlockOrFinal(this,*(short *)(simpleType + 0x2c));
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFinal,pXVar2);
  if ((ulong)*(uint *)(simpleType + 0x40) < 4) {
    pXVar2 = *(XMLCh **)(&DAT_0011c258 + (ulong)*(uint *)(simpleType + 0x40) * 8);
  }
  else {
    pXVar2 = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
  }
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgVariety,pXVar2);
  if (*(int *)(simpleType + 0x40) == 2) {
    pXVar3 = *(XSTypeDefinition **)(simpleType + 0x68);
  }
  else {
    pXVar3 = (XSTypeDefinition *)0x0;
  }
  processTypeDefinitionOrRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgItemTypeDefinition,pXVar3);
  processMemberTypeDefinitions(this,*(XSSimpleTypeDefinitionList **)(simpleType + 0x70));
  processAnnotations(this,*(XSAnnotationList **)(simpleType + 0x78));
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSimpleTypeDefinition);
  return;
}

Assistant:

void PSVIWriterHandlers::processSimpleTypeDefinition(XSSimpleTypeDefinition* simpleType) {
	sendIndentedElementWithID(PSVIUni::fgSimpleTypeDefinition, (XSObject*) simpleType);
	if (simpleType->getAnonymous())
		sendElementEmpty(PSVIUni::fgName);
	else sendElementValue(PSVIUni::fgName, simpleType->getName());
	sendElementValue(PSVIUni::fgTargetNamespace, simpleType->getNamespace());
	processTypeDefinitionOrRef(PSVIUni::fgBaseTypeDefinition, simpleType->getBaseType());
	processTypeDefinitionOrRef(PSVIUni::fgPrimitiveTypeDefinition, simpleType->getPrimitiveType());
	processFacets(simpleType->getFacets(), simpleType->getMultiValueFacets());
	processFundamentalFacets(simpleType);
	sendElementValue(PSVIUni::fgFinal, translateBlockOrFinal(simpleType->getFinal()));
	sendElementValue(PSVIUni::fgVariety, translateSimpleTypeVariety(simpleType->getVariety()));
	processTypeDefinitionOrRef(PSVIUni::fgItemTypeDefinition, simpleType->getItemType());
	processMemberTypeDefinitions(simpleType->getMemberTypes());
	processAnnotations(simpleType->getAnnotations());
	sendUnindentedElement(PSVIUni::fgSimpleTypeDefinition);
}